

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O2

bool svd(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *A,int K,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *U,vector<double,_std::allocator<double>_> *S,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *V)

{
  pointer pvVar1;
  pointer pdVar2;
  int i;
  int n;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  time_t tVar6;
  size_t __n;
  double *x;
  double *x_00;
  size_t __n_00;
  void *__src;
  double *x_01;
  ostream *poVar7;
  int iVar8;
  size_type __new_size;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  int local_a0;
  long local_98;
  value_type_conflict3 local_60;
  vector<double,_std::allocator<double>_> *local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  pvVar1 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(A->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  uVar4 = (long)*(pointer *)
                 ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + 8) -
          *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data;
  uVar5 = uVar4 >> 3;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(U);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(V);
  pdVar2 = (S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    (S->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar2;
  }
  __new_size = (size_type)K;
  local_60 = 0.0;
  local_58 = S;
  std::vector<double,_std::allocator<double>_>::resize(S,__new_size,&local_60);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(U,__new_size);
  n = (int)uVar3;
  lVar10 = 0;
  local_50 = 0;
  if (0 < K) {
    local_50 = (ulong)(uint)K;
  }
  lVar9 = local_50 * 0x18;
  for (; lVar9 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
    local_60 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((U->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar10),(long)n,&local_60);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(V,__new_size);
  lVar10 = uVar4 * 0x20000000;
  local_a0 = (int)uVar5;
  for (lVar12 = 0; lVar9 - lVar12 != 0; lVar12 = lVar12 + 0x18) {
    local_60 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((V->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar12),(long)local_a0,&local_60);
  }
  local_98 = 0;
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  __n = (long)(uVar3 << 0x20) >> 0x1d;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)(uVar3 << 0x20)) {
    uVar4 = __n;
  }
  x = (double *)operator_new__(uVar4);
  x_00 = (double *)operator_new__(uVar4);
  __n_00 = lVar10 >> 0x1d;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar10) {
    uVar4 = __n_00;
  }
  __src = operator_new__(uVar4);
  x_01 = (double *)operator_new__(uVar4);
  uVar4 = 0;
  if (0 < n) {
    uVar4 = uVar3 & 0xffffffff;
  }
  uVar3 = 0;
  if (0 < local_a0) {
    uVar3 = uVar5 & 0xffffffff;
  }
  uVar5 = 0;
  do {
    if (uVar5 == local_50) {
LAB_0010b224:
      operator_delete__(x_00);
      operator_delete__(x_01);
      operator_delete__(x);
      operator_delete__(__src);
      return true;
    }
    uVar11 = 0;
    local_48 = uVar5;
    do {
      for (; uVar11 != uVar4; uVar11 = uVar11 + 1) {
        iVar8 = rand();
        x[uVar11] = (double)((float)iVar8 * 4.656613e-10);
      }
      dVar13 = normalize(x,n);
      uVar11 = 0;
    } while (dVar13 <= eps);
    dVar13 = -1.0;
    dVar14 = 1.0;
    for (iVar8 = 0; (eps <= dVar14 && (iVar8 < MAX_ITER)); iVar8 = iVar8 + 1) {
      memset(x_00,0,__n);
      memset(x_01,0,__n_00);
      for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
          x_01[uVar11] = x[uVar5] *
                         *(double *)
                          (*(long *)&(A->
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data + uVar11 * 8) + x_01[uVar11];
        }
      }
      dVar13 = normalize(x_01,local_a0);
      if (dVar13 < eps) break;
      for (lVar10 = 0; local_98 != lVar10; lVar10 = lVar10 + 0x18) {
        orth(*(double **)
              ((long)&(((V->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + lVar10),x_01,local_a0);
      }
      normalize(x_01,local_a0);
      for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
          x_00[uVar5] = x_01[uVar11] *
                        *(double *)
                         (*(long *)&(A->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + uVar11 * 8) + x_00[uVar5];
        }
      }
      dVar13 = normalize(x_00,n);
      if (dVar13 < eps) break;
      local_38 = dVar13;
      for (lVar10 = 0; local_98 != lVar10; lVar10 = lVar10 + 0x18) {
        orth(*(double **)
              ((long)&(((U->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + lVar10),x_00,n);
      }
      normalize(x_00,n);
      local_40 = 0.0;
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        local_40 = local_40 + (x_00[uVar5] - x[uVar5]) * (x_00[uVar5] - x[uVar5]);
      }
      memcpy(x,x_00,__n);
      memcpy(__src,x_01,__n_00);
      dVar13 = local_38;
      dVar14 = local_40;
    }
    uVar5 = local_48;
    if (dVar13 < eps) {
      poVar7 = std::ostream::_M_insert<double>(dVar13);
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_0010b224;
    }
    (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[local_48] = dVar13;
    memcpy((U->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[local_48].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start,x,__n);
    memcpy((V->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar5].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start,__src,__n_00);
    uVar5 = uVar5 + 1;
    local_98 = local_98 + 0x18;
  } while( true );
}

Assistant:

bool svd(vector<vector<double> > A, int K, vector<vector<double> > &U, vector<double> &S, vector<vector<double> > &V) {
	int M = A.size();
	int N = A[0].size();
	U.clear();
	V.clear();
	S.clear();
	S.resize(K, 0);
	U.resize(K);
	for (int i = 0; i < K; i++)
		U[i].resize(M, 0);
	V.resize(K);
	for (int i = 0; i < K; i++)
		V[i].resize(N, 0);


	srand(time(0));
	double *left_vector = new double[M];
	double *next_left_vector = new double[M];
	double *right_vector = new double[N];
	double *next_right_vector = new double[N];
	int col = 0;
	for (int col = 0; col < K; col++) {
		double diff = 1;
		double r = -1;
		while (1) {
			for (int i = 0; i < M; i++)
				left_vector[i] = (float)rand() / RAND_MAX;
			if (normalize(left_vector, M) > eps)
				break;
		}

		for (int iter = 0; diff >= eps && iter < MAX_ITER; iter++) {
			memset(next_left_vector, 0, sizeof(double)*M);
			memset(next_right_vector, 0, sizeof(double)*N);
			for (int i = 0; i < M; i++)
				for (int j = 0; j < N; j++)
					next_right_vector[j] += left_vector[i] * A[i][j];

			r = normalize(next_right_vector, N);
			if (r < eps) break;
			for (int i = 0; i < col; i++)
				orth(&V[i][0], next_right_vector, N);
			normalize(next_right_vector, N);

			for (int i = 0; i < M; i++)
				for (int j = 0; j < N; j++)
					next_left_vector[i] += next_right_vector[j] * A[i][j];
			r = normalize(next_left_vector, M);
			if (r < eps) break;
			for (int i = 0; i < col; i++)
				orth(&U[i][0], next_left_vector, M);
			normalize(next_left_vector, M);
			diff = 0;
			for (int i = 0; i < M; i++) {
				double d = next_left_vector[i] - left_vector[i];
				diff += d * d;
			}

			memcpy(left_vector, next_left_vector, sizeof(double)*M);
			memcpy(right_vector, next_right_vector, sizeof(double)*N);
		}
		if (r >= eps) {
			S[col] = r;
			memcpy((char *)&U[col][0], left_vector, sizeof(double)*M);
			memcpy((char *)&V[col][0], right_vector, sizeof(double)*N);
		}
		else {
			cout << r << endl;
			break;
		}
	}
	delete[] next_left_vector;
	delete[] next_right_vector;
	delete[] left_vector;
	delete[] right_vector;

	return true;
}